

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkFindMffcSize(Acb_Ntk_t *p,Vec_Int_t *vObjsRefed,Vec_Int_t *vObjsDerefed,int *nGates)

{
  uint uVar1;
  int iObj;
  int *piVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *vRefs;
  int *__s;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  uVar1 = (p->vObjType).nSize;
  vRefs = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  vRefs->nCap = uVar3;
  if (uVar3 == 0) {
    vRefs->pArray = (int *)0x0;
    vRefs->nSize = uVar1;
LAB_003aa733:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar3 << 2);
    vRefs->pArray = __s;
    vRefs->nSize = uVar1;
    if (__s == (int *)0x0) goto LAB_003aa733;
    memset(__s,0,(long)(int)uVar1 << 2);
  }
  if (1 < (int)uVar1) {
    uVar5 = 1;
    do {
      if (uVar1 <= uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar5] != '\0') {
        if ((long)(p->vObjFans).nSize <= (long)uVar5) goto LAB_003aa892;
        iVar4 = (p->vObjFans).pArray[uVar5];
        lVar6 = (long)iVar4;
        if ((lVar6 < 0) || ((p->vFanSto).nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar2 = (p->vFanSto).pArray;
        if (0 < piVar2[lVar6]) {
          lVar8 = 0;
          do {
            if (uVar1 <= (uint)piVar2[lVar6 + lVar8 + 1]) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            __s[(uint)piVar2[lVar6 + lVar8 + 1]] = __s[(uint)piVar2[lVar6 + lVar8 + 1]] + 1;
            lVar8 = lVar8 + 1;
          } while (lVar8 < piVar2[lVar6]);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar1);
  }
  if (0 < vObjsRefed->nSize) {
    lVar6 = 0;
    do {
      Acb_NtkNodeRef_rec(vRefs,p,vObjsRefed->pArray[lVar6],(int *)0x0);
      lVar6 = lVar6 + 1;
    } while (lVar6 < vObjsRefed->nSize);
  }
  iVar4 = vObjsDerefed->nSize;
  if (iVar4 < 1) {
    iVar7 = 0;
    if (__s == (int *)0x0) goto LAB_003aa85a;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iObj = vObjsDerefed->pArray[lVar6];
      if (((long)iObj < 0) || ((int)uVar1 <= iObj)) {
LAB_003aa892:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (__s[iObj] == 0) {
        iVar4 = Acb_NtkNodeRef_rec(vRefs,p,iObj,nGates);
        iVar7 = iVar7 + iVar4;
        iVar4 = vObjsDerefed->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  free(__s);
LAB_003aa85a:
  free(vRefs);
  return iVar7;
}

Assistant:

int Acb_NtkFindMffcSize( Acb_Ntk_t * p, Vec_Int_t * vObjsRefed, Vec_Int_t * vObjsDerefed, int nGates[5] )
{
    Vec_Int_t * vRefs = Vec_IntStart( Acb_NtkObjNumMax(p) );
    int i, iObj, Fanin, * pFanins, Count2 = 0;
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, Fanin, i )
            Vec_IntAddToEntry( vRefs, Fanin, 1 );
    Vec_IntForEachEntry( vObjsRefed, iObj, i )
        Acb_NtkNodeRef_rec( vRefs, p, iObj, NULL );
    Vec_IntForEachEntry( vObjsDerefed, iObj, i )
        if ( Vec_IntEntry(vRefs, iObj) == 0 )
            Count2 += Acb_NtkNodeRef_rec( vRefs, p, iObj, nGates );
    Vec_IntFree( vRefs );
    return Count2;
}